

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O3

void * __thiscall
DefaultSysAllocator::Alloc
          (DefaultSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  SysAllocator *pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  bool bVar5;
  
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    if ((this->failed_[lVar4] == false) &&
       (pSVar1 = this->allocs_[lVar4], pSVar1 != (SysAllocator *)0x0)) {
      iVar3 = (*pSVar1->_vptr_SysAllocator[2])(pSVar1,size,actual_size,alignment);
      if ((void *)CONCAT44(extraout_var,iVar3) != (void *)0x0) {
        return (void *)CONCAT44(extraout_var,iVar3);
      }
      this->failed_[lVar4] = true;
    }
    lVar4 = 1;
    bVar2 = false;
  } while (bVar5);
  this->failed_[0] = false;
  this->failed_[1] = false;
  return (void *)0x0;
}

Assistant:

void* DefaultSysAllocator::Alloc(size_t size, size_t *actual_size,
                                 size_t alignment) {
  for (int i = 0; i < kMaxAllocators; i++) {
    if (!failed_[i] && allocs_[i] != nullptr) {
      void* result = allocs_[i]->Alloc(size, actual_size, alignment);
      if (result != nullptr) {
        return result;
      }
      failed_[i] = true;
    }
  }
  // After both failed, reset "failed_" to false so that a single failed
  // allocation won't make the allocator never work again.
  for (int i = 0; i < kMaxAllocators; i++) {
    failed_[i] = false;
  }
  return nullptr;
}